

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_335521::check(istream *is,char *c,int n)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  char v [1024];
  char local_439;
  char local_438 [1032];
  
  uVar3 = (ulong)(uint)n;
  std::istream::read((char *)is,(long)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"char[",5);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]: expected \"",0xd);
  if (0 < n) {
    uVar2 = 0;
    do {
      local_439 = c[uVar2];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_439,1);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\", got \"",8);
  if (0 < n) {
    uVar2 = 0;
    do {
      local_439 = local_438[uVar2];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_439,1);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (0 < n) {
    uVar2 = 0;
    do {
      if (c[uVar2] != local_438[uVar2]) {
        __assert_fail("c[i] == v[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                      ,0x8e,"void (anonymous namespace)::check(istream &, const char *, int)");
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void
check (istream& is, const char c[/*n*/], int n)
{
    char v[1024];

    assert (n <= (int) sizeof (v));

    Xdr::read<CharIO> (is, v, n);

    cout << "char[" << n << "]: expected \"";

    for (int i = 0; i < n; i++)
        cout << c[i];

    cout << "\", got \"";

    for (int i = 0; i < n; i++)
        cout << v[i];

    cout << "\"" << endl;

    for (int i = 0; i < n; i++)
        assert (c[i] == v[i]);
}